

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_reset(ma_data_converter *pConverter)

{
  long in_RDI;
  ma_resampler *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*(char *)(in_RDI + 299) == '\0') {
    local_4 = MA_SUCCESS;
  }
  else {
    local_4 = ma_resampler_reset(in_stack_ffffffffffffffe8);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_converter_reset(ma_data_converter* pConverter)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    /* There's nothing to do if we're not resampling. */
    if (pConverter->hasResampler == MA_FALSE) {
        return MA_SUCCESS;
    }

    return ma_resampler_reset(&pConverter->resampler);
}